

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
::get_number<unsigned_short,false>
          (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *this,input_format_t format,unsigned_short *result)

{
  bool bVar1;
  reference pvVar2;
  pointer pvVar3;
  undefined2 *in_RDX;
  long in_RDI;
  size_t i;
  array<unsigned_char,_2UL> vec;
  char *in_stack_000000f8;
  input_format_t in_stack_00000104;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_stack_00000108;
  size_type in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffc0;
  value_type_conflict4 in_stack_ffffffffffffffc6;
  value_type_conflict4 in_stack_ffffffffffffffc7;
  ulong local_30;
  undefined1 local_22 [2];
  undefined2 *local_20;
  
  local_20 = in_RDX;
  memset(local_22,0,2);
  local_30 = 0;
  while( true ) {
    if (1 < local_30) {
      pvVar3 = std::array<unsigned_char,_2UL>::data((array<unsigned_char,_2UL> *)0xe0919e);
      *local_20 = *(undefined2 *)pvVar3;
      return true;
    }
    binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::get((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *)CONCAT17(in_stack_ffffffffffffffc7,
                      CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)));
    bVar1 = binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::unexpect_eof(in_stack_00000108,in_stack_00000104,in_stack_000000f8);
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
      in_stack_ffffffffffffffc6 = (value_type_conflict4)*(undefined4 *)(in_RDI + 0x10);
      pvVar2 = std::array<unsigned_char,_2UL>::operator[]
                         ((array<unsigned_char,_2UL> *)
                          CONCAT17(in_stack_ffffffffffffffc7,
                                   CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),
                          in_stack_ffffffffffffffb8);
      *pvVar2 = in_stack_ffffffffffffffc6;
    }
    else {
      in_stack_ffffffffffffffc7 = (value_type_conflict4)*(undefined4 *)(in_RDI + 0x10);
      pvVar2 = std::array<unsigned_char,_2UL>::operator[]
                         ((array<unsigned_char,_2UL> *)
                          CONCAT17(in_stack_ffffffffffffffc7,
                                   CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),
                          in_stack_ffffffffffffffb8);
      *pvVar2 = in_stack_ffffffffffffffc7;
    }
    local_30 = local_30 + 1;
  }
  return false;
}

Assistant:

bool get_number(const input_format_t format, NumberType& result)
    {
        // step 1: read input into array with system's byte order
        std::array<std::uint8_t, sizeof(NumberType)> vec{};
        for (std::size_t i = 0; i < sizeof(NumberType); ++i)
        {
            get();
            if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(format, "number")))
            {
                return false;
            }

            // reverse byte order prior to conversion if necessary
            if (is_little_endian != InputIsLittleEndian)
            {
                vec[sizeof(NumberType) - i - 1] = static_cast<std::uint8_t>(current);
            }
            else
            {
                vec[i] = static_cast<std::uint8_t>(current); // LCOV_EXCL_LINE
            }
        }

        // step 2: convert array into number of type T and return
        std::memcpy(&result, vec.data(), sizeof(NumberType));
        return true;
    }